

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tqapi_cs.cpp
# Opt level: O0

CallResultWrap * tapi_cancel_order1(void *h,char *account_id,char *code,char *entrust_no)

{
  bool bVar1;
  CallResultWrap *this;
  element_type *peVar2;
  char *pcVar3;
  CallResultWrap *cr;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [55];
  allocator local_81;
  string local_80 [32];
  undefined1 local_60 [8];
  CallResult<bool> r;
  TradeApi *tapi;
  char *entrust_no_local;
  char *code_local;
  char *account_id_local;
  void *h_local;
  
  r._40_8_ = h;
  if (h != (void *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,account_id,&local_81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,code,&local_b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e0,entrust_no,(allocator *)((long)&cr + 7));
    (**(code **)(*h + 0x60))(local_60,h,local_80,local_b8,local_e0);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&cr + 7));
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    this = (CallResultWrap *)operator_new(0x10c);
    CallResultWrap::CallResultWrap(this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_60);
    if (bVar1) {
      std::shared_ptr<bool>::operator=(&this->bool_value,(shared_ptr<bool> *)local_60);
      peVar2 = std::__shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>::get
                         (&(this->bool_value).super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>);
      this->value = peVar2;
      this->element_size = 1;
      this->element_count = 1;
      this->value_type = 0xb;
    }
    else {
      pcVar3 = _T((string *)
                  &r.value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                  &this->_msg);
      this->msg = pcVar3;
    }
    tquant::api::CallResult<bool>::~CallResult((CallResult<bool> *)local_60);
    return this;
  }
  __assert_fail("tapi",
                "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/c/api/tqapi_cs.cpp"
                ,0x18a,
                "CallResultWrap *tapi_cancel_order1(void *, const char *, const char *, const char *)"
               );
}

Assistant:

_TQAPI_EXPORT
CallResultWrap* tapi_cancel_order1(void* h, const char* account_id,
                                   const char* code,
                                   const char* entrust_no)
{
    auto tapi = reinterpret_cast<TradeApi*>(h);
    assert(tapi);

    auto r = tapi->cancel_order(account_id, code, entrust_no);
    CallResultWrap* cr = new CallResultWrap();
    if (r.value) {
        cr->bool_value = r.value;
        cr->value = reinterpret_cast<const void*>(cr->bool_value.get());
        cr->element_size = sizeof(bool);
        cr->element_count = 1;
        cr->value_type = VT_BOOL;
    }
    else {
		cr->msg = _T(r.msg, cr->_msg);
    }
    return cr;
}